

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O2

void __thiscall
ElementsTransactionApi_FundRawTransaction_Check1_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_Check1_Test *this)

{
  pointer pTVar1;
  uint32_t uVar2;
  int iVar3;
  pointer hex;
  pointer pCVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  initializer_list<TestFundElementsUtxoVector> __l;
  Txid local_16f8;
  AssertionResult gtest_ar;
  allocator local_16ab;
  allocator local_16aa;
  ElementsTransactionApi api;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext context;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_utxos;
  string local_1560;
  pointer local_1540;
  UtxoFilter filter;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_1530;
  ElementsAddressFactory factory;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  CoinSelectionOption option;
  Amount estimate_fee;
  ConfidentialAssetId fee_asset;
  string local_13f0;
  Privkey local_13d0;
  ElementsUtxoAndOption txin_utxo;
  ConfidentialTransactionController ctx;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e20;
  SigHashType local_e04;
  ElementsConfidentialAddress ct_addr1;
  ExtPubkey key;
  ElementsConfidentialAddress reserve_ct_addr1;
  ConfidentialTransactionContext tx;
  ElementsConfidentialAddress reserve_ct_addr3;
  ElementsConfidentialAddress reserve_ct_addr2;
  Address addr3;
  Address addr2;
  Address addr1;
  Address addr;
  
  if (TestBody()::kFundCoinSelectElementsTestVector3 == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)&txin_utxo,
                 "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
                 (allocator *)&ct_addr1);
      txin_utxo.utxo.block_hash.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      txin_utxo.utxo.txid._vptr_Txid = (_func_int **)0x12a05f20;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)&txin_utxo.utxo.txid.data_,&exp_dummy_asset_a);
      std::__cxx11::string::string
                ((string *)&txin_utxo.utxo.locking_script,
                 "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
                 (allocator *)&reserve_ct_addr1);
      std::__cxx11::string::string
                ((string *)&txin_utxo.utxo.locking_script.script_stack_,
                 "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
                 (allocator *)&reserve_ct_addr2);
      txin_utxo.utxo.redeem_script.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      txin_utxo.utxo.redeem_script.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x4a817c8;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)
                 ((long)&txin_utxo.utxo.redeem_script.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 0x10),&exp_dummy_asset_a);
      std::__cxx11::string::string
                ((string *)&txin_utxo.utxo.address,
                 "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
                 (allocator *)&reserve_ct_addr3);
      std::__cxx11::string::string
                ((string *)txin_utxo.utxo.address.address_.field_2._M_local_buf,
                 "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
                 (allocator *)&addr);
      txin_utxo.utxo.address.hash_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      txin_utxo.utxo.address.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x4a817c80;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)
                 ((long)&txin_utxo.utxo.address.pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8),
                 &exp_dummy_asset_a);
      std::__cxx11::string::string
                ((string *)
                 ((long)&txin_utxo.utxo.address.schnorr_pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 0x10),
                 "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
                 (allocator *)&addr1);
      std::__cxx11::string::string
                ((string *)&txin_utxo.utxo.address.script_tree_.super_TapBranch.script_.script_data_
                 ,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
                 (allocator *)&addr2);
      txin_utxo.utxo.address.script_tree_.super_TapBranch.script_.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      txin_utxo.utxo.address.script_tree_.super_TapBranch.script_.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2540be4;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)&txin_utxo.utxo.address.script_tree_.super_TapBranch.root_commitment_,
                 &exp_dummy_asset_a);
      std::__cxx11::string::string
                ((string *)
                 ((long)&txin_utxo.utxo.address.script_tree_.super_TapBranch.branch_list_.
                         super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                 + 8),"sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))"
                 ,(allocator *)&addr3);
      std::__cxx11::string::string
                ((string *)
                 ((long)&txin_utxo.utxo.address.script_tree_.nodes_.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl + 0x10),
                 "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",(allocator *)&tx
                );
      txin_utxo.utxo.address.redeem_script_.script_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      txin_utxo.utxo.address.redeem_script_.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x9502f90;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)
                 ((long)&txin_utxo.utxo.address.redeem_script_.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl + 8),&exp_dummy_asset_a);
      std::__cxx11::string::string
                ((string *)((long)&txin_utxo.utxo.address.format_data_.map_._M_t._M_impl + 8),
                 "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
                 (allocator *)&context);
      std::__cxx11::string::string
                ((string *)((long)&txin_utxo.utxo.address.format_data_.map_._M_t._M_impl + 0x28),
                 "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
                 (allocator *)&key);
      txin_utxo.utxo.descriptor.field_2._8_4_ = 0;
      txin_utxo.utxo.amount.amount_ = 2500000000;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)&txin_utxo.utxo.amount.ignore_check_,&exp_dummy_asset_a);
      std::__cxx11::string::string
                ((string *)&txin_utxo.utxo.asset.data_,
                 "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
                 (allocator *)&option);
      std::__cxx11::string::string
                ((string *)&txin_utxo.utxo.confidential_address,
                 "0000000000000000000000000000000000000000000000000000000000000b01",
                 (allocator *)&ctx);
      txin_utxo.utxo.confidential_address.unblinded_address_.address_.field_2._M_allocated_capacity.
      _0_4_ = 0;
      txin_utxo.utxo.confidential_address.unblinded_address_.address_.field_2._8_8_ = 0x19abe00;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)&txin_utxo.utxo.confidential_address.unblinded_address_.hash_,
                 &exp_dummy_asset_b);
      std::__cxx11::string::string
                ((string *)
                 ((long)&txin_utxo.utxo.confidential_address.unblinded_address_.pubkey_.data_.data_
                 + 8),"sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))"
                 ,(allocator *)&map_target_value);
      std::__cxx11::string::string
                ((string *)
                 ((long)&txin_utxo.utxo.confidential_address.unblinded_address_.schnorr_pubkey_.
                         data_.data_ + 0x10),
                 "0000000000000000000000000000000000000000000000000000000000000b02",
                 (allocator *)&reserve_txout_address);
      txin_utxo.utxo.confidential_address.unblinded_address_.script_tree_.super_TapBranch.script_.
      script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      txin_utxo.utxo.confidential_address.unblinded_address_.script_tree_.super_TapBranch.script_.
      script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xb71b0;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)
                 ((long)&txin_utxo.utxo.confidential_address.unblinded_address_.script_tree_.
                         super_TapBranch.script_ + 0x18),&exp_dummy_asset_b);
      std::__cxx11::string::string
                ((string *)
                 &txin_utxo.utxo.confidential_address.unblinded_address_.script_tree_.
                  super_TapBranch.root_commitment_,
                 "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
                 (allocator *)&factory);
      std::__cxx11::string::string
                ((string *)
                 ((long)&txin_utxo.utxo.confidential_address.unblinded_address_.script_tree_.
                         super_TapBranch.branch_list_ + 8),
                 "0000000000000000000000000000000000000000000000000000000000000b03",
                 (allocator *)&fee_asset);
      txin_utxo.utxo.confidential_address.unblinded_address_.script_tree_.nodes_.
      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      txin_utxo.utxo.confidential_address.unblinded_address_.redeem_script_._vptr_Script =
           (_func_int **)0x14a61a62;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)
                 &txin_utxo.utxo.confidential_address.unblinded_address_.redeem_script_.script_data_
                 ,&exp_dummy_asset_b);
      std::__cxx11::string::string
                ((string *)
                 ((long)&txin_utxo.utxo.confidential_address.unblinded_address_.redeem_script_.
                         script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 + 8),"sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))"
                 ,(allocator *)&gtest_ar);
      std::__cxx11::string::string
                ((string *)
                 ((long)&txin_utxo.utxo.confidential_address.unblinded_address_.format_data_.map_.
                         _M_t + 8),
                 "0000000000000000000000000000000000000000000000000000000000000b04",
                 (allocator *)&local_16f8);
      txin_utxo.utxo.confidential_address.unblinded_address_.format_data_.map_._M_t._M_impl.
      super__Rb_tree_header._M_node_count._0_4_ = 0;
      txin_utxo.utxo.confidential_address.confidential_key_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x119ed3e;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)
                 ((long)&txin_utxo.utxo.confidential_address.confidential_key_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8),
                 &exp_dummy_asset_b);
      std::__cxx11::string::string
                ((string *)txin_utxo.utxo.confidential_address.address_.field_2._M_local_buf,
                 "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
                 (allocator *)&local_1560);
      std::__cxx11::string::string
                ((string *)
                 ((long)&txin_utxo.utxo.asset_blind_factor.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 8),"0000000000000000000000000000000000000000000000000000000000000c01",
                 (allocator *)&local_13d0);
      txin_utxo.utxo.amount_blind_factor.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      txin_utxo.utxo.amount_blind_factor.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x23e8eb8;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)&txin_utxo.utxo.value_commitment,&exp_dummy_asset_c);
      std::__cxx11::string::string
                ((string *)&txin_utxo.utxo.value_commitment.version_,
                 "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
                 (allocator *)&local_13f0);
      std::__cxx11::string::string
                ((string *)
                 ((long)&txin_utxo.utxo.scriptsig_template.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                 0x10),"0000000000000000000000000000000000000000000000000000000000000c02",
                 (allocator *)&utxos);
      txin_utxo.is_issuance = false;
      txin_utxo.is_blind_issuance = false;
      txin_utxo.is_pegin = false;
      txin_utxo._1267_1_ = 0;
      txin_utxo.claim_script._vptr_Script = (_func_int **)0x79252f0;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)&txin_utxo.claim_script.script_data_,&exp_dummy_asset_c);
      std::__cxx11::string::string
                ((string *)
                 &txin_utxo.claim_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
                 "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
                 (allocator *)&selected_utxos);
      __l._M_len = 0xc;
      __l._M_array = (iterator)&txin_utxo;
      std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::vector
                (&TestBody::kFundCoinSelectElementsTestVector3,__l,
                 (allocator_type *)&selected_txin_utxos);
      lVar5 = 0x4d0;
      do {
        TestFundElementsUtxoVector::~TestFundElementsUtxoVector
                  ((TestFundElementsUtxoVector *)((long)&txin_utxo.utxo.block_height + lVar5));
        lVar5 = lVar5 + -0x70;
      } while (lVar5 != -0x70);
      __cxa_atexit(std::
                   vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
                   ~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
      __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
    }
  }
  if (TestBody()::kExpTxData_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)&TestBody()::kExpTxData_abi_cxx11_,
                 "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
                 ,(allocator *)&txin_utxo);
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
    }
  }
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kLiquidV1);
  std::__cxx11::string::string
            ((string *)&txin_utxo,
             "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
             ,(allocator *)&ct_addr1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,(string *)&txin_utxo);
  std::__cxx11::string::~string((string *)&txin_utxo);
  utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (&utxos,((long)TestBody::kFundCoinSelectElementsTestVector3.
                           super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)TestBody::kFundCoinSelectElementsTestVector3.
                          super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x70);
  pTVar1 = TestBody::kFundCoinSelectElementsTestVector3.
           super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = 0;
  for (hex = TestBody::kFundCoinSelectElementsTestVector3.
             super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
             ._M_impl.super__Vector_impl_data._M_start; hex != pTVar1; hex = hex + 1) {
    cfd::core::Txid::Txid((Txid *)&ct_addr1);
    if ((hex->txid)._M_string_length != 0) {
      cfd::core::Txid::Txid((Txid *)&txin_utxo,&hex->txid);
      cfd::core::Txid::operator=((Txid *)&ct_addr1,(Txid *)&txin_utxo);
      cfd::core::Txid::~Txid((Txid *)&txin_utxo);
    }
    cfd::core::Txid::Txid((Txid *)&txin_utxo,&hex->txid);
    cfd::core::Txid::operator=
              (&utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6].txid,(Txid *)&txin_utxo);
    cfd::core::Txid::~Txid((Txid *)&txin_utxo);
    utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6].vout = hex->vout;
    cfd::core::Amount::Amount((Amount *)&txin_utxo,hex->amount);
    utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6].amount.ignore_check_ =
         (bool)txin_utxo.utxo.block_hash._vptr_BlockHash._0_1_;
    utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6].amount.amount_ = txin_utxo.utxo.block_height;
    cfd::core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)&txin_utxo,&hex->asset);
    cfd::core::ConfidentialAssetId::operator=
              (&utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6].asset,(ConfidentialAssetId *)&txin_utxo);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&txin_utxo);
    std::__cxx11::string::_M_assign
              ((string *)
               &utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6].descriptor);
    utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6].address_type = kP2shP2wpkhAddress;
    uVar6 = (ulong)((int)uVar6 + 1);
    cfd::core::Txid::~Txid((Txid *)&ct_addr1);
  }
  std::__cxx11::string::string
            ((string *)&txin_utxo,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,(allocator *)&ct_addr1);
  cfd::core::ExtPubkey::ExtPubkey(&key,(string *)&txin_utxo);
  std::__cxx11::string::~string((string *)&txin_utxo);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&fee_asset,&exp_dummy_asset_a);
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &map_target_value._M_t._M_impl.super__Rb_tree_header._M_header;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       map_target_value._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txin_utxo,&exp_dummy_asset_a);
  cfd::core::Amount::Amount((Amount *)&ct_addr1,0x6e6f7c0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&map_target_value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txin_utxo,
             (Amount *)&ct_addr1);
  std::__cxx11::string::~string((string *)&txin_utxo);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txin_utxo,&exp_dummy_asset_b);
  cfd::core::Amount::Amount((Amount *)&ct_addr1,0x14b18c08);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&map_target_value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txin_utxo,
             (Amount *)&ct_addr1);
  std::__cxx11::string::~string((string *)&txin_utxo);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txin_utxo,&exp_dummy_asset_c);
  cfd::core::Amount::Amount((Amount *)&ct_addr1,0x23e8e54);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&map_target_value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txin_utxo,
             (Amount *)&ct_addr1);
  std::__cxx11::string::~string((string *)&txin_utxo);
  std::__cxx11::string::string
            ((string *)&txin_utxo,"ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h",
             (allocator *)&ct_addr1);
  cfd::AddressFactory::GetAddress(&addr,&factory.super_AddressFactory,(string *)&txin_utxo);
  std::__cxx11::string::~string((string *)&txin_utxo);
  std::__cxx11::string::string
            ((string *)&txin_utxo,"ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e",
             (allocator *)&ct_addr1);
  cfd::AddressFactory::GetAddress(&addr1,&factory.super_AddressFactory,(string *)&txin_utxo);
  std::__cxx11::string::~string((string *)&txin_utxo);
  std::__cxx11::string::string
            ((string *)&txin_utxo,"ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn",
             (allocator *)&ct_addr1);
  cfd::AddressFactory::GetAddress(&addr2,&factory.super_AddressFactory,(string *)&txin_utxo);
  std::__cxx11::string::~string((string *)&txin_utxo);
  std::__cxx11::string::string
            ((string *)&txin_utxo,"ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m",
             (allocator *)&ct_addr1);
  cfd::AddressFactory::GetAddress(&addr3,&factory.super_AddressFactory,(string *)&txin_utxo);
  std::__cxx11::string::~string((string *)&txin_utxo);
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       reserve_txout_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txin_utxo,&exp_dummy_asset_a);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&ct_addr1,&addr1);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&reserve_txout_address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txin_utxo,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ct_addr1);
  std::__cxx11::string::~string((string *)&ct_addr1);
  std::__cxx11::string::~string((string *)&txin_utxo);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txin_utxo,&exp_dummy_asset_b);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&ct_addr1,&addr2);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&reserve_txout_address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txin_utxo,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ct_addr1);
  std::__cxx11::string::~string((string *)&ct_addr1);
  std::__cxx11::string::~string((string *)&txin_utxo);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&txin_utxo,&exp_dummy_asset_c);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&ct_addr1,&addr3);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&reserve_txout_address,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&txin_utxo,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ct_addr1);
  std::__cxx11::string::~string((string *)&ct_addr1);
  std::__cxx11::string::~string((string *)&txin_utxo);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&txin_utxo,&key,0x5a);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&reserve_ct_addr1,(ExtPubkey *)&txin_utxo);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&ct_addr1,&addr,(ConfidentialKey *)&reserve_ct_addr1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reserve_ct_addr1);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&txin_utxo);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&txin_utxo,&key,0x5b);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&reserve_ct_addr2,(ExtPubkey *)&txin_utxo);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&reserve_ct_addr1,&addr1,(ConfidentialKey *)&reserve_ct_addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reserve_ct_addr2);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&txin_utxo);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&txin_utxo,&key,0x5c);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&reserve_ct_addr3,(ExtPubkey *)&txin_utxo);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&reserve_ct_addr2,&addr2,(ConfidentialKey *)&reserve_ct_addr3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&reserve_ct_addr3);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&txin_utxo);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&txin_utxo,&key,0x5d);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&context,(ExtPubkey *)&txin_utxo);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&reserve_ct_addr3,&addr3,(ConfidentialKey *)&context);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&context);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&txin_utxo);
  selected_utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  selected_utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  selected_utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  selected_txin_utxos.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(&txin_utxo);
  std::__cxx11::string::string
            ((string *)&option,"9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff",
             (allocator *)&ctx);
  cfd::core::Txid::Txid((Txid *)&context,(string *)&option);
  cfd::core::Txid::operator=(&txin_utxo.utxo.txid,(Txid *)&context);
  cfd::core::Txid::~Txid((Txid *)&context);
  std::__cxx11::string::~string((string *)&option);
  cfd::core::Amount::Amount((Amount *)&context,0x6b22c20);
  txin_utxo.utxo.amount.ignore_check_ =
       (bool)context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_1_
  ;
  cfd::core::ConfidentialAssetId::operator=(&txin_utxo.utxo.asset,&exp_dummy_asset_a);
  std::__cxx11::string::assign((char *)&txin_utxo.utxo.descriptor);
  txin_utxo.utxo.address_type = kP2shP2wpkhAddress;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  push_back(&selected_txin_utxos,&txin_utxo);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
            (&selected_utxos,&txin_utxo.utxo);
  cfd::core::Amount::Amount(&estimate_fee);
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  append_txout_addresses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&option);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&option);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&option,0.15);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&option,0.15);
  cfd::CoinSelectionOption::SetFeeAsset(&option,&fee_asset);
  cfd::CoinSelectionOption::SetBlindInfo(&option,0,0x24);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&context,(AbstractTransaction *)&tx);
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (&ctx,&api,(string *)&context,&utxos,&map_target_value,&selected_txin_utxos,
             &reserve_txout_address,&fee_asset,true,0.15,&estimate_fee,&filter,&option,
             &append_txout_addresses,kCfdOutOfRangeError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  std::__cxx11::string::~string((string *)&context);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)&context,&ctx.super_AbstractTransactionController);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"kExpTxData","ctx.GetHex()",&TestBody()::kExpTxData_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&context);
  std::__cxx11::string::~string((string *)&context);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&context);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_16f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x618,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)&context);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&context);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_16f8._vptr_Txid = (_func_int **)CONCAT44(local_16f8._vptr_Txid._4_4_,0x26a);
  gtest_ar._0_8_ = cfd::core::Amount::GetSatoshiValue(&estimate_fee);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&context,"618","estimate_fee.GetSatoshiValue()",(int *)&local_16f8,
             (long *)&gtest_ar);
  if ((char)context.super_ConfidentialTransaction.super_AbstractTransaction.
            _vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)
        CONCAT71(context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_.
                 _1_7_,context.super_ConfidentialTransaction.super_AbstractTransaction.
                       wally_tx_pointer_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(context.super_ConfidentialTransaction.super_AbstractTransaction.
                                  wally_tx_pointer_._1_7_,
                                  context.super_ConfidentialTransaction.super_AbstractTransaction.
                                  wally_tx_pointer_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_16f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x619,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_)
  ;
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  local_16f8._vptr_Txid =
       (_func_int **)
       ((long)append_txout_addresses.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)append_txout_addresses.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&context,"size_t{3}","append_txout_addresses.size()",
             (unsigned_long *)&gtest_ar,(unsigned_long *)&local_16f8);
  if ((char)context.super_ConfidentialTransaction.super_AbstractTransaction.
            _vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)
        CONCAT71(context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_.
                 _1_7_,context.super_ConfidentialTransaction.super_AbstractTransaction.
                       wally_tx_pointer_._0_1_) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT71(context.super_ConfidentialTransaction.super_AbstractTransaction.
                                  wally_tx_pointer_._1_7_,
                                  context.super_ConfidentialTransaction.super_AbstractTransaction.
                                  wally_tx_pointer_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_16f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x61a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&context.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_)
  ;
  if ((long)append_txout_addresses.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)append_txout_addresses.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x60) {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&context,&addr1);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"addr1.GetAddress().c_str()",
               "append_txout_addresses[2].c_str()",
               (char *)CONCAT71(context.super_ConfidentialTransaction.super_AbstractTransaction.
                                _vptr_AbstractTransaction._1_7_,
                                (char)context.super_ConfidentialTransaction.
                                      super_AbstractTransaction._vptr_AbstractTransaction),
               append_txout_addresses.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&context);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&context);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_16f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61d,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)&context);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&context);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&context,&addr2);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",
               (char *)CONCAT71(context.super_ConfidentialTransaction.super_AbstractTransaction.
                                _vptr_AbstractTransaction._1_7_,
                                (char)context.super_ConfidentialTransaction.
                                      super_AbstractTransaction._vptr_AbstractTransaction),
               ((append_txout_addresses.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&context);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&context);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_16f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61e,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)&context);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&context);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&context,&addr3);
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"addr3.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",
               (char *)CONCAT71(context.super_ConfidentialTransaction.super_AbstractTransaction.
                                _vptr_AbstractTransaction._1_7_,
                                (char)context.super_ConfidentialTransaction.
                                      super_AbstractTransaction._vptr_AbstractTransaction),
               append_txout_addresses.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&context);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&context);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_16f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61f,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)&context);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&context);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)&gtest_ar,&ctx.super_AbstractTransactionController);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&context,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ct_addrs.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&ct_addrs,&ct_addr1);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&ct_addrs,&reserve_ct_addr1);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&ct_addrs,&reserve_ct_addr2);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&ct_addrs,&reserve_ct_addr3);
  cfd::ConfidentialTransactionContext::CollectInputUtxo(&context,&selected_utxos);
  cfd::ConfidentialTransactionContext::CollectInputUtxo(&context,&utxos);
  cfd::ConfidentialTransactionContext::Blind
            (&context,&ct_addrs,1,0,0x24,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
  cfd::core::ConfidentialTransaction::GetTxInList
            (&local_1530,&context.super_ConfidentialTransaction);
  local_1540 = local_1530.
               super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar4 = local_1530.
                super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar4 != local_1540; pCVar4 = pCVar4 + 1
      ) {
    cfd::core::Txid::Txid(&local_16f8,&(pCVar4->super_AbstractTxInReference).txid_);
    cfd::core::OutPoint::OutPoint
              ((OutPoint *)&gtest_ar,&local_16f8,(pCVar4->super_AbstractTxInReference).vout_);
    std::__cxx11::string::string
              ((string *)&local_1560,
               "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_16aa);
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_e20,&local_1560);
    std::__cxx11::string::string
              ((string *)&local_13f0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
               &local_16ab);
    cfd::core::Privkey::FromWif(&local_13d0,&local_13f0,kCustomChain,true);
    cfd::core::SigHashType::SigHashType(&local_e04);
    cfd::ConfidentialTransactionContext::SignWithKey
              (&context,(OutPoint *)&gtest_ar,(Pubkey *)&local_e20,&local_13d0,&local_e04,true);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_13d0);
    std::__cxx11::string::~string((string *)&local_13f0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e20);
    std::__cxx11::string::~string((string *)&local_1560);
    cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    cfd::core::Txid::~Txid(&local_16f8);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector(&local_1530);
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&context.super_ConfidentialTransaction);
  if (uVar2 != 0x1018) {
    uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&context.super_ConfidentialTransaction);
    if (uVar2 != 0x1019) {
      uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&context.super_ConfidentialTransaction);
      if (uVar2 != 0x101a) {
        local_16f8._vptr_Txid = (_func_int **)CONCAT44(local_16f8._vptr_Txid._4_4_,100);
        local_1560._M_dataplus._M_p._0_4_ =
             cfd::core::ConfidentialTransaction::GetVsize(&context.super_ConfidentialTransaction);
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)&gtest_ar,"100","context.GetVsize()",(int *)&local_16f8,
                   (uint *)&local_1560);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_16f8);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1560,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                     ,0x633,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1560,(Message *)&local_16f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1560);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_16f8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
    }
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&ct_addrs);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&context);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctx);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option.fee_asset_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&append_txout_addresses);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(&txin_utxo);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&selected_txin_utxos);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&selected_utxos);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&reserve_ct_addr3);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&reserve_ct_addr2);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&reserve_ct_addr1);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&ct_addr1);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&reserve_txout_address._M_t);
  cfd::core::Address::~Address(&addr3);
  cfd::core::Address::~Address(&addr2);
  cfd::core::Address::~Address(&addr1);
  cfd::core::Address::~Address(&addr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&map_target_value._M_t);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&fee_asset);
  cfd::core::ExtPubkey::~ExtPubkey(&key);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_Check1) {
  // from cfd-go
  static const std::vector<TestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    // mnemonic: token hair neglect leader furnace obtain sadness tool you father paddle skate remain carry impact dinosaur correct essay rent illness predict mercy exist ring
    // xpriv: xprv9s21ZrQH143K4QXrTfC9L43GKCuLcDiBCWjyVqfZUTzoPJWUstD4HTJKGz1U5jAGZzKshcX6cCyZ1ZdxSUQLz92pEZWEGwxa39ks2vhTsfA
    // derive: 44h/0h/0h/0/*
    {
      "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
      0,
      312500000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
    },
    {
      "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
      0,
      78125000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
    },
    {
      "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
      0,
      1250000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
    },
    {
      "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
      0,
      39062500,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
    },
    {
      "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
      0,
      156250000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
    },
    {
      "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
      0,
      2500000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b01",
      0,
      26918400,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b02",
      0,
      750000,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b03",
      0,
      346430050,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b04",
      0,
      18476350,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c01",
      0,
      37654200,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c02",
      0,
      127030000,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
    },
  };
  static const std::string kExpTxData = "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000";

  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);

  try {
    ConfidentialTransactionContext tx("010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000");
    std::vector<cfd::UtxoData> utxos;
    utxos.resize(kFundCoinSelectElementsTestVector3.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{115800000}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{347180040}));
    map_target_value.emplace(exp_dummy_asset_c.GetHex(), Amount(int64_t{37654100}));
    Address addr = factory.GetAddress("ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h");
    Address addr1 = factory.GetAddress("ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e");
    Address addr2 = factory.GetAddress("ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn");
    Address addr3 = factory.GetAddress("ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m");
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_c.GetHex(), addr3.GetAddress());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        addr, key.DerivePubkey(90).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
        addr3, key.DerivePubkey(93).GetPubkey());
    std::vector<UtxoData> selected_utxos;
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    ElementsUtxoAndOption txin_utxo;
    txin_utxo.utxo.txid = Txid("9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff");
    txin_utxo.utxo.amount = Amount(int64_t{112340000});
    txin_utxo.utxo.asset = exp_dummy_asset_a;
    txin_utxo.utxo.descriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
    txin_utxo.utxo.address_type = AddressType::kP2shP2wpkhAddress;
    selected_txin_utxos.push_back(txin_utxo);
    selected_utxos.push_back(txin_utxo.utxo);
    double fee_rate = 0.15;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(0.15);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kLiquidV1);

    EXPECT_EQ(kExpTxData, ctx.GetHex());
    EXPECT_EQ(618, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{3}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{3})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[2].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
      EXPECT_STREQ(addr3.GetAddress().c_str(), append_txout_addresses[1].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(ct_addr1);
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    ct_addrs.push_back(reserve_ct_addr3);
    context.CollectInputUtxo(selected_utxos);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5"));
    }
    if ((context.GetVsize() != 4120) && (context.GetVsize() != 4121) &&
        (context.GetVsize() != 4122)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}